

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslerror.cpp
# Opt level: O0

void __thiscall QSslError::QSslError(QSslError *this,SslError error)

{
  QSslErrorPrivate *this_00;
  pointer pQVar1;
  SslError in_ESI;
  pointer in_stack_ffffffffffffffd8;
  
  this_00 = (QSslErrorPrivate *)operator_new(0x10);
  QSslErrorPrivate::QSslErrorPrivate(this_00);
  std::unique_ptr<QSslErrorPrivate,std::default_delete<QSslErrorPrivate>>::
  unique_ptr<std::default_delete<QSslErrorPrivate>,void>
            ((unique_ptr<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_> *)this_00,
             in_stack_ffffffffffffffd8);
  pQVar1 = std::unique_ptr<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_>::operator->
                     ((unique_ptr<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_> *)
                      0x396db3);
  pQVar1->error = in_ESI;
  return;
}

Assistant:

QSslError::QSslError(SslError error)
    : d(new QSslErrorPrivate)
{
    d->error = error;
}